

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_state_callback_force(callback_type_e c_type)

{
  fio_defer_task_s task;
  int iVar1;
  fio_ls_embd_s *pfVar2;
  int *piVar3;
  callback_data_s *tmp_3;
  callback_data_s *tmp_2;
  fio_ls_embd_s *pos_2;
  callback_data_s *tmp_1;
  fio_ls_embd_s *pos_1;
  callback_data_s *tmp;
  fio_ls_embd_s *pos;
  fio_ls_embd_s copy;
  callback_type_e c_type_local;
  
  if ((-1 < (int)c_type) && (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK))) {
    pos = (fio_ls_embd_s *)&pos;
    copy.prev = pos;
    copy.next._4_4_ = c_type;
    fio_lock(&callback_collection[c_type].lock);
    fio_state_callback_ensure(callback_collection + copy.next._4_4_);
    if (copy.next._4_4_ < FIO_CALL_ON_IDLE) {
      for (tmp = (callback_data_s *)callback_collection[copy.next._4_4_].callbacks.next;
          tmp != (callback_data_s *)&callback_collection[copy.next._4_4_].callbacks;
          tmp = (callback_data_s *)(tmp->node).next) {
        pfVar2 = (fio_ls_embd_s *)fio_malloc(0x20);
        if (pfVar2 == (fio_ls_embd_s *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3367"
                          );
          }
          kill(0,2);
          piVar3 = __errno_location();
          exit(*piVar3);
        }
        pfVar2->prev = (tmp->node).prev;
        pfVar2->next = (tmp->node).next;
        pfVar2[1].prev = (fio_ls_embd_s *)tmp->func;
        pfVar2[1].next = (fio_ls_embd_s *)tmp->arg;
        fio_ls_embd_unshift((fio_ls_embd_s *)&pos,pfVar2);
      }
    }
    else if (copy.next._4_4_ == FIO_CALL_ON_IDLE) {
      for (tmp_1 = (callback_data_s *)callback_collection[7].callbacks.next;
          tmp_1 != (callback_data_s *)&callback_collection[copy.next._4_4_].callbacks;
          tmp_1 = (callback_data_s *)(tmp_1->node).next) {
        task.arg1 = tmp_1->func;
        task.func = fio_state_on_idle_perform;
        task.arg2 = tmp_1->arg;
        fio_defer_push_task_fn(task,&task_queue_normal);
        fio_defer_thread_signal();
      }
    }
    else {
      for (tmp_2 = (callback_data_s *)callback_collection[copy.next._4_4_].callbacks.next;
          tmp_2 != (callback_data_s *)&callback_collection[copy.next._4_4_].callbacks;
          tmp_2 = (callback_data_s *)(tmp_2->node).next) {
        pfVar2 = (fio_ls_embd_s *)fio_malloc(0x20);
        if (pfVar2 == (fio_ls_embd_s *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3390"
                          );
          }
          kill(0,2);
          piVar3 = __errno_location();
          exit(*piVar3);
        }
        pfVar2->prev = (tmp_2->node).prev;
        pfVar2->next = (tmp_2->node).next;
        pfVar2[1].prev = (fio_ls_embd_s *)tmp_2->func;
        pfVar2[1].next = (fio_ls_embd_s *)tmp_2->arg;
        fio_ls_embd_push((fio_ls_embd_s *)&pos,pfVar2);
      }
    }
    fio_unlock(&callback_collection[copy.next._4_4_].lock);
    while (iVar1 = fio_ls_embd_any((fio_ls_embd_s *)&pos), iVar1 != 0) {
      pfVar2 = fio_ls_embd_pop((fio_ls_embd_s *)&pos);
      if (pfVar2[1].prev != (fio_ls_embd_s *)0x0) {
        (*(code *)pfVar2[1].prev)(pfVar2[1].next);
      }
      fio_free(pfVar2);
    }
  }
  return;
}

Assistant:

void fio_state_callback_force(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  /* copy collection */
  fio_ls_embd_s copy = FIO_LS_INIT(copy);
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  switch (c_type) {            /* the difference between `unshift` and `push` */
  case FIO_CALL_ON_INITIALIZE: /* fallthrough */
  case FIO_CALL_PRE_START:     /* fallthrough */
  case FIO_CALL_BEFORE_FORK:   /* fallthrough */
  case FIO_CALL_AFTER_FORK:    /* fallthrough */
  case FIO_CALL_IN_CHILD:      /* fallthrough */
  case FIO_CALL_IN_MASTER:     /* fallthrough */
  case FIO_CALL_ON_START:      /* fallthrough */
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = fio_malloc(sizeof(*tmp));
      FIO_ASSERT_ALLOC(tmp);
      *tmp = *(FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
      fio_ls_embd_unshift(&copy, &tmp->node);
    }
    break;

  case FIO_CALL_ON_IDLE: /* idle callbacks are orderless and evented */
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = FIO_LS_EMBD_OBJ(callback_data_s, node, pos);
      fio_defer_push_task(fio_state_on_idle_perform,
                          (void *)(uintptr_t)tmp->func, tmp->arg);
    }
    break;

  case FIO_CALL_ON_SHUTDOWN:     /* fallthrough */
  case FIO_CALL_ON_FINISH:       /* fallthrough */
  case FIO_CALL_ON_PARENT_CRUSH: /* fallthrough */
  case FIO_CALL_ON_CHILD_CRUSH:  /* fallthrough */
  case FIO_CALL_AT_EXIT:         /* fallthrough */
  case FIO_CALL_NEVER:           /* fallthrough */
  default:
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = fio_malloc(sizeof(*tmp));
      FIO_ASSERT_ALLOC(tmp);
      *tmp = *(FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
      fio_ls_embd_push(&copy, &tmp->node);
    }
    break;
  }

  fio_unlock(&callback_collection[c_type].lock);
  /* run callbacks + free data */
  while (fio_ls_embd_any(&copy)) {
    callback_data_s *tmp =
        FIO_LS_EMBD_OBJ(callback_data_s, node, fio_ls_embd_pop(&copy));
    if (tmp->func) {
      tmp->func(tmp->arg);
    }
    fio_free(tmp);
  }
}